

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecPOMDPDiscrete.cpp
# Opt level: O1

void __thiscall
DecPOMDPDiscrete::ExtractMADPDiscrete
          (DecPOMDPDiscrete *this,MultiAgentDecisionProcessDiscrete *madp)

{
  pointer pcVar1;
  MultiAgentDecisionProcessDiscrete *this_00;
  size_t nrAgents;
  TransitionModelDiscrete *pTVar2;
  ObservationModelDiscrete *pOVar3;
  long lVar4;
  ulong uVar5;
  StateDistribution *p;
  ulong uVar6;
  char *__end;
  ulong uVar7;
  string local_80;
  MultiAgentDecisionProcessDiscrete *local_60;
  string local_58;
  MADPComponentDiscreteActions *local_38;
  
  nrAgents = (**(code **)(*(long *)&(this->super_MultiAgentDecisionProcessDiscrete).
                                    super_MultiAgentDecisionProcess + 0x10))();
  MultiAgentDecisionProcess::SetNrAgents(&madp->super_MultiAgentDecisionProcess,nrAgents);
  pcVar1 = (this->super_MultiAgentDecisionProcessDiscrete).super_MultiAgentDecisionProcess._m_name.
           _m_name._M_dataplus._M_p;
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_80,pcVar1,
             pcVar1 + (this->super_MultiAgentDecisionProcessDiscrete).
                      super_MultiAgentDecisionProcess._m_name._m_name._M_string_length);
  std::__cxx11::string::_M_assign
            ((string *)&(madp->super_MultiAgentDecisionProcess)._m_name._m_name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  pcVar1 = (this->super_MultiAgentDecisionProcessDiscrete).super_MultiAgentDecisionProcess._m_name.
           _m_description._M_dataplus._M_p;
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_80,pcVar1,
             pcVar1 + (this->super_MultiAgentDecisionProcessDiscrete).
                      super_MultiAgentDecisionProcess._m_name._m_description._M_string_length);
  std::__cxx11::string::_M_assign
            ((string *)&(madp->super_MultiAgentDecisionProcess)._m_name._m_description);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  pTVar2 = (TransitionModelDiscrete *)
           (**(code **)(*(long *)&(this->super_MultiAgentDecisionProcessDiscrete).
                                  super_MultiAgentDecisionProcess + 0x160))(this);
  madp->_m_p_tModel = pTVar2;
  pOVar3 = (ObservationModelDiscrete *)
           (**(code **)(*(long *)&(this->super_MultiAgentDecisionProcessDiscrete).
                                  super_MultiAgentDecisionProcess + 0x168))(this);
  madp->_m_p_oModel = pOVar3;
  lVar4 = (**(code **)(*(long *)&(this->super_MultiAgentDecisionProcessDiscrete).
                                 super_MultiAgentDecisionProcess + 0x30))(this);
  if (lVar4 != 0) {
    uVar7 = 0;
    do {
      lVar4 = (**(code **)(*(long *)&(this->super_MultiAgentDecisionProcessDiscrete).
                                     super_MultiAgentDecisionProcess + 0x38))(this,uVar7);
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_80,*(long *)(lVar4 + 8),
                 *(long *)(lVar4 + 0x10) + *(long *)(lVar4 + 8));
      MADPComponentDiscreteStates::AddState(&madp->_m_S,&local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      uVar7 = (ulong)((int)uVar7 + 1);
      uVar5 = (**(code **)(*(long *)&(this->super_MultiAgentDecisionProcessDiscrete).
                                     super_MultiAgentDecisionProcess + 0x30))(this);
    } while (uVar5 != uVar7);
  }
  p = (StateDistribution *)
      (**(code **)(*(long *)&(this->super_MultiAgentDecisionProcessDiscrete).
                             super_MultiAgentDecisionProcess + 0x50))(this);
  local_60 = madp;
  MADPComponentDiscreteStates::SetISD(&madp->_m_S,p);
  lVar4 = (**(code **)(*(long *)&(this->super_MultiAgentDecisionProcessDiscrete).
                                 super_MultiAgentDecisionProcess + 0x10))(this);
  if (lVar4 != 0) {
    local_38 = (MADPComponentDiscreteActions *)&local_60->_m_O;
    uVar7 = 0;
    do {
      lVar4 = (**(code **)(*(long *)&(this->super_MultiAgentDecisionProcessDiscrete).
                                     super_MultiAgentDecisionProcess + 200))(this,uVar7);
      if (lVar4 != 0) {
        uVar5 = 0;
        do {
          lVar4 = (**(code **)(*(long *)&(this->super_MultiAgentDecisionProcessDiscrete).
                                         super_MultiAgentDecisionProcess + 0xd8))(this,uVar7,uVar5);
          local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_80,*(long *)(lVar4 + 8),
                     *(long *)(lVar4 + 0x10) + *(long *)(lVar4 + 8));
          local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"","");
          MADPComponentDiscreteObservations::AddObservation
                    ((MADPComponentDiscreteObservations *)local_38,(Index)uVar7,&local_80,&local_58)
          ;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != &local_80.field_2) {
            operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
          }
          uVar5 = (ulong)((int)uVar5 + 1);
          uVar6 = (**(code **)(*(long *)&(this->super_MultiAgentDecisionProcessDiscrete).
                                         super_MultiAgentDecisionProcess + 200))(this,uVar7);
        } while (uVar6 != uVar5);
      }
      uVar7 = (ulong)((Index)uVar7 + 1);
      uVar5 = (**(code **)(*(long *)&(this->super_MultiAgentDecisionProcessDiscrete).
                                     super_MultiAgentDecisionProcess + 0x10))(this);
    } while (uVar5 != uVar7);
  }
  MADPComponentDiscreteObservations::ConstructJointObservations(&local_60->_m_O);
  lVar4 = (**(code **)(*(long *)&(this->super_MultiAgentDecisionProcessDiscrete).
                                 super_MultiAgentDecisionProcess + 0x10))(this);
  if (lVar4 != 0) {
    local_38 = &local_60->_m_A;
    uVar7 = 0;
    do {
      lVar4 = (**(code **)(*(long *)&(this->super_MultiAgentDecisionProcessDiscrete).
                                     super_MultiAgentDecisionProcess + 0x68))(this,uVar7);
      if (lVar4 != 0) {
        uVar5 = 0;
        do {
          lVar4 = (**(code **)(*(long *)&(this->super_MultiAgentDecisionProcessDiscrete).
                                         super_MultiAgentDecisionProcess + 0x80))(this,uVar7,uVar5);
          local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_80,*(long *)(lVar4 + 8),
                     *(long *)(lVar4 + 0x10) + *(long *)(lVar4 + 8));
          local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"","");
          MADPComponentDiscreteActions::AddAction(local_38,(Index)uVar7,&local_80,&local_58);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != &local_80.field_2) {
            operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
          }
          uVar5 = (ulong)((int)uVar5 + 1);
          uVar6 = (**(code **)(*(long *)&(this->super_MultiAgentDecisionProcessDiscrete).
                                         super_MultiAgentDecisionProcess + 0x68))(this,uVar7);
        } while (uVar6 != uVar5);
      }
      uVar7 = (ulong)((Index)uVar7 + 1);
      uVar5 = (**(code **)(*(long *)&(this->super_MultiAgentDecisionProcessDiscrete).
                                     super_MultiAgentDecisionProcess + 0x10))(this);
    } while (uVar5 != uVar7);
  }
  this_00 = local_60;
  MADPComponentDiscreteActions::ConstructJointActions(&local_60->_m_A);
  MultiAgentDecisionProcessDiscrete::SetInitialized(this_00,true);
  return;
}

Assistant:

void
DecPOMDPDiscrete::ExtractMADPDiscrete(MultiAgentDecisionProcessDiscrete *madp)
{
    madp->SetNrAgents(GetNrAgents());
    madp->SetName(GetName());
    madp->SetDescription(GetDescription());

    // transition model
    madp->SetTransitionModelPtr(
        const_cast<TransitionModelDiscrete*>(GetTransitionModelDiscretePtr()));

    // observation model
    madp->SetObservationModelPtr(
        const_cast<ObservationModelDiscrete*>(GetObservationModelDiscretePtr()));

    // MADPComponentDiscreteStates
    for(Index s=0;s!=GetNrStates();++s)
        madp->AddState(GetState(s)->GetName());

    madp->SetISD(GetISD());

    // MADPComponentDiscreteObservations
    for(Index id=0;id!=GetNrAgents();++id)
        for(Index o=0;o!=GetNrObservations(id);++o)
            madp->AddObservation(id,GetObservation(id,o)->GetName());
    madp->ConstructJointObservations();

    // MADPComponentDiscreteActions
    for(Index id=0;id!=GetNrAgents();++id)
        for(Index o=0;o!=GetNrActions(id);++o)
            madp->AddAction(id,GetAction(id,o)->GetName());
    madp->ConstructJointActions();

    madp->Initialize();
}